

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O2

Activation * __thiscall
PyreNet::ActivationFactory::getActivation(ActivationFactory *this,activationType activation)

{
  mapped_type pAVar1;
  iterator iVar2;
  Activation *pAVar3;
  mapped_type *ppAVar4;
  ActivationFactory *this_00;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lg;
  activationType activation_local;
  
  lg._12_4_ = activation;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,(mutex_type *)instanceMutex);
  this_00 = this;
  iVar2 = std::
          _Hashtable<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&lg.field_0xc);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pAVar3 = generateActivation(this_00,lg._12_4_);
    ppAVar4 = std::__detail::
              _Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&lg.field_0xc);
    *ppAVar4 = pAVar3;
  }
  ppAVar4 = std::__detail::
            _Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<PyreNet::LayerDefinition::activationType,_std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>,_std::allocator<std::pair<const_PyreNet::LayerDefinition::activationType,_PyreNet::Activation_*>_>,_std::__detail::_Select1st,_std::equal_to<PyreNet::LayerDefinition::activationType>,_std::hash<PyreNet::LayerDefinition::activationType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&lg.field_0xc);
  pAVar1 = *ppAVar4;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return pAVar1;
}

Assistant:

Activation *ActivationFactory::getActivation(LayerDefinition::activationType activation) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        if (this->activationCache.find(activation) == this->activationCache.end()) { // activation function not in cache
            this->activationCache[activation] = generateActivation(activation);
        }
        return this->activationCache[activation];
    }